

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Freight_train.cpp
# Opt level: O1

void __thiscall Freight_train::set_weight_of_freight(Freight_train *this)

{
  int *piVar1;
  long lVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter weight of freight: ",0x19);
  piVar1 = &this->weight_of_freight;
  std::istream::operator>>((istream *)&std::cin,piVar1);
  if ((((&char*::typeinfo)[*(long *)(std::cin + -0x18)] & 5) != 0) || (this->weight_of_freight == 0)
     ) {
    lVar2 = (long)&std::cin + *(long *)(std::cin + -0x18);
    do {
      do {
        std::ios::clear((_Ios_Iostate)lVar2);
        std::istream::ignore((long)&std::cin,-1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Your input data is incorrect, try again",0x27);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
        std::ostream::put('\0');
        std::ostream::flush();
        std::istream::operator>>((istream *)&std::cin,piVar1);
        lVar2 = (long)&std::cin + *(long *)(std::cin + -0x18);
      } while (((&char*::typeinfo)[*(long *)(std::cin + -0x18)] & 5) != 0);
    } while (*piVar1 == 0);
  }
  return;
}

Assistant:

void Freight_train::set_weight_of_freight() {
    std::cout << "Enter weight of freight: ";
    std::cin >> weight_of_freight;
    while (std::cin.fail() || weight_of_freight == 0) {
        std::cin.clear();
        std::cin.ignore(numeric_limits<streamsize>::max(), '\n');
        std::cout << "Your input data is incorrect, try again" << std::endl;
        std::cin >> weight_of_freight;
    }
}